

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::dispose
          (ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this)

{
  Branch *firstElement;
  RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *pRVar1;
  Branch *pBVar2;
  Branch *endCopy;
  Branch *posCopy;
  Branch *ptrCopy;
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pBVar2 = this->endPtr;
  if (firstElement != (Branch *)0x0) {
    this->ptr = (Branch *)0x0;
    this->pos = (RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)0x0;
    this->endPtr = (Branch *)0x0;
    ArrayDisposer::dispose<kj::_::RaceSuccessfulPromiseNodeBase::Branch>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x50,
               ((long)pBVar2 - (long)firstElement) / 0x50);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }